

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

bool __thiscall
icu_63::number::impl::DecimalQuantity::fitsInLong(DecimalQuantity *this,bool ignoreFraction)

{
  bool bVar1;
  int8_t iVar2;
  int32_t iVar3;
  int local_24;
  int8_t digit;
  int p;
  int magnitude;
  bool ignoreFraction_local;
  DecimalQuantity *this_local;
  
  bVar1 = isZero(this);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else if ((-1 < this->scale) || (ignoreFraction)) {
    iVar3 = getMagnitude(this);
    if (iVar3 < 0x12) {
      this_local._7_1_ = true;
    }
    else if (iVar3 < 0x13) {
      for (local_24 = 0; local_24 < this->precision; local_24 = local_24 + 1) {
        iVar2 = getDigit(this,0x12 - local_24);
        if (iVar2 < fitsInLong::INT64_BCD[local_24]) {
          return true;
        }
        if (fitsInLong::INT64_BCD[local_24] < iVar2) {
          return false;
        }
      }
      this_local._7_1_ = isNegative(this);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DecimalQuantity::fitsInLong(bool ignoreFraction) const {
    if (isZero()) {
        return true;
    }
    if (scale < 0 && !ignoreFraction) {
        return false;
    }
    int magnitude = getMagnitude();
    if (magnitude < 18) {
        return true;
    }
    if (magnitude > 18) {
        return false;
    }
    // Hard case: the magnitude is 10^18.
    // The largest int64 is: 9,223,372,036,854,775,807
    for (int p = 0; p < precision; p++) {
        int8_t digit = getDigit(18 - p);
        static int8_t INT64_BCD[] = { 9, 2, 2, 3, 3, 7, 2, 0, 3, 6, 8, 5, 4, 7, 7, 5, 8, 0, 8 };
        if (digit < INT64_BCD[p]) {
            return true;
        } else if (digit > INT64_BCD[p]) {
            return false;
        }
    }
    // Exactly equal to max long plus one.
    return isNegative();
}